

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O3

void __thiscall kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,SwitchStmt *stmt)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  int iVar3;
  Var *var;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *peVar5;
  pointer psVar6;
  pointer psVar7;
  ostream *poVar8;
  _Rb_tree_node_base *p_Var9;
  ulong uVar10;
  mapped_type *pmVar11;
  iterator iVar12;
  VarException *this_00;
  long lVar13;
  _Rb_tree_node_base *p_Var14;
  SystemVerilogCodeGen *this_01;
  char *pcVar15;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var17;
  __normal_iterator<std::shared_ptr<kratos::Const>_*,_std::vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>_>
  __i;
  long lVar18;
  key_type *pkVar19;
  undefined1 auVar20 [8];
  bool bVar21;
  string_view sVar22;
  string_view format_str;
  format_args args;
  initializer_list<const_kratos::IRNode_*> __l;
  SwitchStmt *local_108;
  element_type *local_100;
  string local_f8;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_d8;
  key_type *local_c0;
  _Hashtable<kratos::StmtBlock_*,_std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::StmtBlock_*>,_std::hash<kratos::StmtBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_b8;
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  *local_b0;
  _Rb_tree_node_base *local_a8;
  Stream *local_a0;
  undefined1 auStack_98 [8];
  vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_> conds;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  string local_68;
  allocator_type local_41;
  SystemVerilogCodeGen *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_a0 = &this->stream_;
  puVar1 = &(this->stream_).super_stringstream.field_0x10;
  sVar22 = indent(this);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,sVar22._M_str,sVar22._M_len);
  pcVar15 = "";
  bVar21 = (this->options_).unique_case != false;
  if (bVar21) {
    pcVar15 = "unique";
  }
  lVar13 = 6;
  if (!bVar21) {
    lVar13 = 0;
  }
  local_40 = this;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar15,lVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," case (",7);
  var = (stmt->target_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (stmt->target_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  Stream::var_str_abi_cxx11_(&local_68,local_a0,var);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_68._M_dataplus._M_p,local_68._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
  puVar2 = &(local_40->stream_).super_stringstream.field_0x90;
  *(long *)puVar2 = *(long *)puVar2 + 1;
  local_f8._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_f8,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  local_40->indent_ = local_40->indent_ + 1;
  auStack_98 = (undefined1  [8])0x0;
  conds.
  super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  conds.
  super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>::
  reserve((vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
           *)auStack_98,(stmt->body_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  p_Var9 = (stmt->body_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a8 = &(stmt->body_)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var9 != local_a8) {
    do {
      if (*(long *)(p_Var9 + 1) != 0) {
        std::vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>::
        emplace_back<std::shared_ptr<kratos::Const>const&>
                  ((vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>
                    *)auStack_98,(shared_ptr<kratos::Const> *)(p_Var9 + 1));
      }
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
    } while (p_Var9 != local_a8);
  }
  psVar7 = conds.
           super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  auVar20 = auStack_98;
  if (auStack_98 !=
      (undefined1  [8])
      conds.
      super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar18 = (long)conds.
                   super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                   ._M_impl.super__Vector_impl_data._M_start - (long)auStack_98;
    uVar10 = lVar18 >> 4;
    lVar13 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar13 == 0; lVar13 = lVar13 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Const>*,std::vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SystemVerilogCodeGen::stmt_code(kratos::SwitchStmt*)::__0>>
              (auStack_98,
               conds.
               super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
               ._M_impl.super__Vector_impl_data._M_start,((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar18 < 0x101) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Const>*,std::vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>>,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SystemVerilogCodeGen::stmt_code(kratos::SwitchStmt*)::__0>>
                (auVar20,psVar7);
    }
    else {
      pkVar19 = (key_type *)((long)auVar20 + 0x100);
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Const>*,std::vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>>,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SystemVerilogCodeGen::stmt_code(kratos::SwitchStmt*)::__0>>
                (auVar20,pkVar19);
      for (; pkVar19 != psVar7; pkVar19 = pkVar19 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Const>*,std::vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>>,__gnu_cxx::__ops::_Val_comp_iter<kratos::SystemVerilogCodeGen::stmt_code(kratos::SwitchStmt*)::__0>>
                  (pkVar19);
      }
    }
  }
  local_68._M_dataplus._M_p = (pointer)0x0;
  if (conds.
      super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      conds.
      super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>::
    _M_realloc_insert<decltype(nullptr)>
              ((vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>
                *)auStack_98,
               (iterator)
               conds.
               super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
               ._M_impl.super__Vector_impl_data._M_start,(void **)&local_68);
  }
  else {
    ((conds.
      super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->
    super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
    ((conds.
      super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->
    super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    conds.
    super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         conds.
         super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
         ._M_impl.super__Vector_impl_data._M_start + 1;
  }
  this_01 = local_40;
  local_c0 = conds.
             super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (auStack_98 !=
      (undefined1  [8])
      conds.
      super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_b0 = &stmt->body_;
    local_b8 = &(local_40->label_index_)._M_h;
    auVar20 = auStack_98;
    do {
      p_Var9 = (stmt->body_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var9 == (_Rb_tree_node_base *)0x0) {
LAB_0019c9f1:
        local_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
      }
      else {
        peVar5 = (((key_type *)auVar20)->
                 super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        p_Var14 = local_a8;
        do {
          if (*(element_type **)(p_Var9 + 1) >= peVar5) {
            p_Var14 = p_Var9;
          }
          p_Var9 = (&p_Var9->_M_left)[*(element_type **)(p_Var9 + 1) < peVar5];
        } while (p_Var9 != (_Base_ptr)0x0);
        if ((p_Var14 == local_a8) || (peVar5 < *(element_type **)(p_Var14 + 1))) goto LAB_0019c9f1;
        pmVar11 = std::
                  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                  ::at(local_b0,(key_type *)auVar20);
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pmVar11->
                     super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        ;
        local_38 = (pmVar11->super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                   )._M_refcount._M_pi;
        if (local_38 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else if (__libc_single_threaded == '\0') {
          LOCK();
          local_38->_M_use_count = local_38->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_38->_M_use_count = local_38->_M_use_count + 1;
        }
      }
      sVar22 = indent(this_01);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)puVar1,sVar22._M_str,sVar22._M_len);
      peVar5 = (((key_type *)auVar20)->super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      if (peVar5 == (element_type *)0x0) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"default","");
      }
      else {
        local_70 = (((key_type *)auVar20)->
                   super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
        if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_70->_M_use_count = local_70->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_70->_M_use_count = local_70->_M_use_count + 1;
          }
        }
        Stream::var_str_abi_cxx11_(&local_68,local_a0,&peVar5->super_Var);
      }
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_68._M_dataplus._M_p,local_68._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 &&
          peVar5 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
      }
      if (paVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
LAB_0019cb7e:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"begin end",9);
        this_01 = local_40;
        puVar2 = &(local_40->stream_).super_stringstream.field_0x90;
        *(long *)puVar2 = *(long *)puVar2 + 1;
        local_68._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,(char *)&local_68,1);
      }
      else {
        psVar6 = (((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                    *)(paVar16->_M_local_buf + 0xc0))->
                 super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (psVar6 == *(pointer *)(paVar16->_M_local_buf + 200)) {
          if ((((key_type *)auVar20)->super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>)
              ._M_ptr != (element_type *)0x0) {
            this_00 = (VarException *)__cxa_allocate_exception(0x10);
            peVar5 = (((key_type *)auVar20)->
                     super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            p_Var4 = (((key_type *)auVar20)->
                     super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                     _M_pi;
            if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
              }
            }
            Stream::var_str_abi_cxx11_(&local_f8,local_a0,&peVar5->super_Var);
            local_d8.
            super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT71(local_f8._M_dataplus._M_p._1_7_,local_f8._M_dataplus._M_p._0_1_);
            local_d8.
            super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)local_f8._M_string_length;
            format_str.size_ = 0xd;
            format_str.data_ = (char *)0x28;
            args.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.args_ = in_R9.args_;
            args.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)&local_d8;
            fmt::v7::detail::vformat_abi_cxx11_
                      (&local_68,(detail *)"Switch statement condition {0} is empty!",format_str,
                       args);
            local_100 = (((key_type *)auVar20)->
                        super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            __l._M_len = 2;
            __l._M_array = (iterator)&local_108;
            local_108 = stmt;
            std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                      (&local_d8,__l,&local_41);
            VarException::VarException(this_00,&local_68,&local_d8);
            __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
          }
          if ((((key_type *)auVar20)->super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>)
              ._M_ptr == (element_type *)0x0) goto LAB_0019cb7e;
        }
        if (((long)*(pointer *)(paVar16->_M_local_buf + 200) - (long)psVar6 == 0x10) &&
           (local_68._M_dataplus._M_p = (pointer)paVar16,
           iVar12 = std::
                    _Hashtable<kratos::StmtBlock_*,_std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::StmtBlock_*>,_std::hash<kratos::StmtBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find(local_b8,(key_type *)&local_68),
           iVar12.
           super__Node_iterator_base<std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
           ._M_cur == (__node_type *)0x0)) {
          psVar6 = (((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                      *)(paVar16->_M_local_buf + 0xc0))->
                   super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar13 = *(long *)&psVar6->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>;
          _Var17._M_pi = (psVar6->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>).
                         _M_refcount._M_pi;
          if (_Var17._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (*(int *)(lVar13 + 0x78) == 3) {
              local_40->skip_indent_ = true;
              lVar13 = *(long *)&psVar6->
                                 super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>;
              bVar21 = true;
              _Var17._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              goto LAB_0019cc8f;
            }
          }
          else {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (_Var17._M_pi)->_M_use_count = (_Var17._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (_Var17._M_pi)->_M_use_count = (_Var17._M_pi)->_M_use_count + 1;
            }
            iVar3 = *(int *)(lVar13 + 0x78);
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var17._M_pi);
            if (iVar3 == 3) {
              psVar6 = (((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                          *)(paVar16->_M_local_buf + 0xc0))->
                       super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              _Var17._M_pi = (psVar6->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>).
                             _M_refcount._M_pi;
              local_40->skip_indent_ = true;
              lVar13 = *(long *)&psVar6->
                                 super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>;
              if (_Var17._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                bVar21 = true;
                _Var17._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              }
              else {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (_Var17._M_pi)->_M_use_count = (_Var17._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (_Var17._M_pi)->_M_use_count = (_Var17._M_pi)->_M_use_count + 1;
                }
                bVar21 = false;
              }
LAB_0019cc8f:
              (**local_40->_vptr_SystemVerilogCodeGen)(local_40,lVar13);
              this_01 = local_40;
              if (!bVar21) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var17._M_pi);
              }
              goto LAB_0019cbb4;
            }
          }
        }
        this_01 = local_40;
        local_40->indent_ = local_40->indent_ + 1;
        (**local_40->_vptr_SystemVerilogCodeGen)(local_40,paVar16);
        this_01->indent_ = this_01->indent_ - 1;
      }
LAB_0019cbb4:
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      }
      auVar20 = (undefined1  [8])((long)auVar20 + 0x10);
    } while (auVar20 != (undefined1  [8])local_c0);
  }
  this_01->indent_ = this_01->indent_ - 1;
  sVar22 = indent(this_01);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,sVar22._M_str,sVar22._M_len);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"endcase",7);
  puVar1 = &(local_40->stream_).super_stringstream.field_0x90;
  *(long *)puVar1 = *(long *)puVar1 + 1;
  local_68._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_68,1);
  std::vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
           *)auStack_98);
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(SwitchStmt* stmt) {
    stream_ << indent() << (options_.unique_case ? "unique" : "") << " case ("
            << stream_.var_str(stmt->target()) << ")" << stream_.endl();
    indent_++;
    auto const& body = stmt->body();
    std::vector<std::shared_ptr<Const>> conds;
    conds.reserve(body.size());
    for (auto const& iter : body) {
        if (iter.first) conds.emplace_back(iter.first);
    }
    std::sort(conds.begin(), conds.end(),
              [](const auto& lhs, const auto& rhs) { return lhs->value() < rhs->value(); });
    conds.emplace_back(nullptr);

    for (auto& cond : conds) {
        const auto& stmt_blk = (body.find(cond) != body.end()) ? body.at(cond) : nullptr;
        stream_ << indent() << (cond ? stream_.var_str(cond) : "default") << ": ";
        if (stmt_blk && stmt_blk->empty() && cond) {
            throw VarException(
                ::format("Switch statement condition {0} is empty!", stream_.var_str(cond)),
                {stmt, cond.get()});
        } else if (!stmt_blk || (stmt_blk->empty() && !cond)) {
            //  empty default case
            stream_ << "begin end" << stream_.endl();
        } else {
            // directly output the code if the block only has 1 element
            if (stmt_blk->size() == 1 && label_index_.find(stmt_blk.get()) == label_index_.end() &&
                stmt_blk->get_stmt(0)->type() == StatementType::Assign) {
                skip_indent_ = true;
                dispatch_node((*stmt_blk)[0].get());
            } else {
                indent_++;
                dispatch_node(stmt_blk.get());
                indent_--;
            }
        }
    }

    indent_--;
    stream_ << indent() << "endcase" << stream_.endl();
}